

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.c
# Opt level: O1

void av1_convolve_2d_sr_avx2
               (uint8_t *src,int32_t src_stride,uint8_t *dst,int32_t dst_stride,int32_t w,int32_t h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int32_t subpel_x_qn,int32_t subpel_y_qn,ConvolveParams *conv_params)

{
  uint uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  int16_t *piVar5;
  int16_t *piVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  long lVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  long lVar33;
  uint uVar34;
  undefined1 (*pauVar35) [16];
  byte bVar36;
  byte bVar37;
  byte bVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  ulong uVar42;
  int iVar43;
  long lVar44;
  int iVar45;
  undefined1 (*pauVar46) [16];
  undefined4 in_register_00000034;
  long lVar47;
  undefined1 (*pauVar48) [32];
  int iVar49;
  undefined8 *puVar50;
  uint8_t *puVar51;
  uint uVar52;
  ulong uVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  ulong uVar59;
  int iVar60;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  short sVar73;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  int16_t im_block [1120];
  ulong local_8f70;
  uint8_t *local_8f68;
  undefined1 (*local_8f30) [16];
  undefined1 (*local_8f28) [16];
  uint local_8ea0;
  undefined1 local_8e80 [32];
  undefined1 local_8e60 [32];
  undefined1 local_8e40 [32];
  undefined1 local_8e00 [32];
  undefined1 local_8de0 [32];
  undefined1 local_8dc0 [32];
  undefined1 local_8da0 [32];
  undefined1 local_8d80 [32];
  undefined1 local_8c60 [16];
  undefined1 auStack_8c50 [16];
  undefined1 local_8c40 [16];
  undefined1 auStack_8c30 [16];
  undefined1 local_8c20 [16];
  undefined1 auStack_8c10 [16];
  undefined1 local_8c00 [16];
  undefined1 auStack_8bf0 [16];
  undefined1 local_8be0 [16];
  undefined1 auStack_8bd0 [16];
  undefined1 local_8bc0 [16];
  undefined1 auStack_8bb0 [35712];
  
  local_8f70 = CONCAT44(in_register_00000034,src_stride);
  uVar2 = filter_params_x->taps;
  uVar53 = (ulong)((subpel_x_qn & 0xfU) * (uint)uVar2);
  uVar3 = filter_params_y->taps;
  uVar59 = (ulong)((subpel_y_qn & 0xfU) * (uint)uVar3);
  piVar5 = filter_params_x->filter_ptr;
  piVar6 = filter_params_y->filter_ptr;
  if (uVar2 == 0xc || uVar3 == 0xc) {
    local_8f68 = dst;
    if (uVar2 < 9) {
      iVar43 = conv_params->round_0;
      bVar38 = 0x16 - (char)iVar43;
      bVar36 = (byte)conv_params->round_1;
      uVar52 = 0xe - (iVar43 + conv_params->round_1);
      iVar49 = 1 << (bVar38 - bVar36 & 0x1f);
      local_8ea0 = 8;
      if ((piVar5[uVar53 + 7] == 0 && piVar5[uVar53] == 0) &&
         (local_8ea0 = 6, piVar5[uVar53 + 6] == 0 && piVar5[uVar53 + 1] == 0)) {
        local_8ea0 = (uint)(piVar5[uVar53 + 5] != 0 || piVar5[uVar53 + 2] != 0) * 2 + 2;
      }
      auVar62._16_16_ = *(undefined1 (*) [16])(piVar5 + uVar53);
      auVar62._0_16_ = *(undefined1 (*) [16])(piVar5 + uVar53);
      uVar53 = 0xc;
      if (((uVar3 != 0xc) && (uVar53 = 8, piVar6[uVar59 + 7] == 0 && piVar6[uVar59] == 0)) &&
         (uVar53 = 6, piVar6[uVar59 + 6] == 0 && piVar6[uVar59 + 1] == 0)) {
        uVar53 = (ulong)((uint)(piVar6[uVar59 + 5] != 0 || piVar6[uVar59 + 2] != 0) * 2 + 2);
      }
      auVar62 = vpsraw_avx2(auVar62,1);
      if (local_8ea0 == 6) {
        auVar61 = vpshufb_avx2(auVar62,_DAT_0056c080);
        auVar80 = vpshufb_avx2(auVar62,_DAT_0056c0a0);
        auVar69 = vpshufb_avx2(auVar62,_DAT_0056c0c0);
      }
      else {
        auVar61 = vpshufb_avx2(auVar62,_DAT_0056c020);
        auVar80 = vpshufb_avx2(auVar62,_DAT_0056c040);
        auVar69 = vpshufb_avx2(auVar62,_DAT_0056c060);
      }
      auVar76 = *(undefined1 (*) [16])(piVar6 + uVar59);
      auVar70._16_16_ = auVar76;
      auVar70._0_16_ = auVar76;
      iVar60 = (int)uVar53;
      if (iVar60 == 6) {
        auVar70._16_16_ = *(undefined1 (*) [16])(piVar6 + uVar59 + 1);
        auVar70._0_16_ = *(undefined1 (*) [16])(piVar6 + uVar59 + 1);
      }
      if (0 < w) {
        sVar73 = (short)((uint)(1 << ((byte)(iVar43 - 1U) & 0x1f)) >> 1) + 0x2000;
        local_8e80._4_4_ = ((1 << (bVar36 & 0x1f)) >> 1) + (1 << (bVar38 & 0x1f));
        iVar49 = ((1 << ((byte)uVar52 & 0x1f)) >> 1) - ((iVar49 >> 1) + iVar49);
        auVar76 = vpshufd_avx(auVar76,0xff);
        auVar87._2_2_ = sVar73;
        auVar87._0_2_ = sVar73;
        auVar87._4_2_ = sVar73;
        auVar87._6_2_ = sVar73;
        auVar87._8_2_ = sVar73;
        auVar87._10_2_ = sVar73;
        auVar87._12_2_ = sVar73;
        auVar87._14_2_ = sVar73;
        auVar87._16_2_ = sVar73;
        auVar87._18_2_ = sVar73;
        auVar87._20_2_ = sVar73;
        auVar87._22_2_ = sVar73;
        auVar87._24_2_ = sVar73;
        auVar87._26_2_ = sVar73;
        auVar87._28_2_ = sVar73;
        auVar87._30_2_ = sVar73;
        local_8e80._0_4_ = local_8e80._4_4_;
        local_8e80._8_4_ = local_8e80._4_4_;
        local_8e80._12_4_ = local_8e80._4_4_;
        local_8e80._16_4_ = local_8e80._4_4_;
        local_8e80._20_4_ = local_8e80._4_4_;
        local_8e80._24_4_ = local_8e80._4_4_;
        local_8e80._28_4_ = local_8e80._4_4_;
        auVar77 = ZEXT464((uint)conv_params->round_1);
        auVar78 = ZEXT3264(CONCAT428(iVar49,CONCAT424(iVar49,CONCAT420(iVar49,CONCAT416(iVar49,
                                                  CONCAT412(iVar49,CONCAT48(iVar49,CONCAT44(iVar49,
                                                  iVar49))))))));
        auVar81 = ZEXT464(uVar52);
        auVar62 = vpshufb_avx2(auVar62,_DAT_0056c000);
        local_8e60._8_8_ = auVar76._0_8_;
        local_8e60._0_8_ = local_8e60._8_8_;
        local_8e60._16_8_ = local_8e60._8_8_;
        local_8e60._24_8_ = local_8e60._8_8_;
        uVar59 = (ulong)((local_8ea0 >> 1) - 1);
        lVar44 = (long)(((int)(uVar53 >> 1) + -1) * src_stride);
        lVar33 = -uVar59 - lVar44;
        auVar82 = vpshufd_avx2(auVar70,0xaa);
        auVar84 = ZEXT3264(auVar82);
        auVar82 = vpshufd_avx2(auVar70,0x55);
        auVar70 = vpshufd_avx2(auVar70,0);
        iVar49 = iVar60 + h;
        lVar55 = (long)src_stride;
        lVar56 = (long)(iVar60 + -3 + h);
        lVar57 = (long)dst_stride;
        lVar58 = (long)h;
        lVar54 = (ulong)(uint)w - 4;
        pauVar35 = (undefined1 (*) [16])(src + (-uVar59 - lVar44));
        lVar44 = lVar55 * 2;
        lVar9 = lVar57 * 2;
        auVar89._16_16_ = _DAT_00517c80;
        auVar89._0_16_ = _DAT_00517c80;
        auVar74._16_16_ = _DAT_00517860;
        auVar74._0_16_ = _DAT_00517860;
        uVar53 = 0;
        do {
          lVar47 = 0;
          auVar76 = ZEXT416(iVar43 - 1U);
          if (local_8ea0 == 4) {
            if (3 < iVar49) {
              pauVar48 = (undefined1 (*) [32])local_8c60;
              lVar47 = 0;
              pauVar46 = pauVar35;
              do {
                auVar63._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar46 + lVar55) +
                     ZEXT116(1) * *pauVar46;
                auVar63._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar46 + lVar55);
                auVar75 = vpshufb_avx2(auVar63,auVar89);
                auVar66 = vpshufb_avx2(auVar63,auVar74);
                auVar75 = vpmaddubsw_avx2(auVar75,auVar80);
                auVar66 = vpmaddubsw_avx2(auVar66,auVar69);
                auVar75 = vpaddw_avx2(auVar87,auVar75);
                auVar75 = vpaddw_avx2(auVar75,auVar66);
                auVar75 = vpsraw_avx2(auVar75,auVar76);
                *pauVar48 = auVar75;
                lVar47 = lVar47 + 2;
                pauVar48 = pauVar48 + 1;
                pauVar46 = (undefined1 (*) [16])(*pauVar46 + lVar44);
              } while (lVar47 < lVar56);
            }
            iVar45 = (int)lVar47;
            auVar79 = *(undefined1 (*) [16])(src + (long)(iVar45 * src_stride) + uVar53 + lVar33);
            auVar64._0_16_ = ZEXT116(0) * auVar79 + ZEXT116(1) * auVar79;
            auVar64._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar79;
            auVar89 = vpshufb_avx2(auVar64,auVar89);
            auVar74 = vpshufb_avx2(auVar64,auVar74);
            auVar89 = vpmaddubsw_avx2(auVar89,auVar80);
            auVar74 = vpmaddubsw_avx2(auVar74,auVar69);
LAB_00445a83:
            auVar89 = vpaddw_avx2(auVar87,auVar89);
          }
          else {
            if (local_8ea0 == 6) {
              auVar75._16_16_ = _DAT_00517870;
              auVar75._0_16_ = _DAT_00517870;
              if (3 < iVar49) {
                pauVar48 = (undefined1 (*) [32])local_8c60;
                lVar47 = 0;
                pauVar46 = pauVar35;
                do {
                  auVar65._0_16_ =
                       ZEXT116(0) * *(undefined1 (*) [16])(*pauVar46 + lVar55) +
                       ZEXT116(1) * *pauVar46;
                  auVar65._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                       ZEXT116(1) * *(undefined1 (*) [16])(*pauVar46 + lVar55);
                  auVar66 = vpshufb_avx2(auVar65,auVar89);
                  auVar67 = vpshufb_avx2(auVar65,auVar74);
                  auVar68 = vpshufb_avx2(auVar65,auVar75);
                  auVar65 = vpmaddubsw_avx2(auVar66,auVar61);
                  auVar66 = vpmaddubsw_avx2(auVar67,auVar80);
                  auVar67 = vpmaddubsw_avx2(auVar68,auVar69);
                  auVar66 = vpaddw_avx2(auVar66,auVar67);
                  auVar65 = vpaddw_avx2(auVar87,auVar65);
                  auVar66 = vpaddw_avx2(auVar65,auVar66);
                  auVar66 = vpsraw_avx2(auVar66,auVar76);
                  *pauVar48 = auVar66;
                  lVar47 = lVar47 + 2;
                  pauVar48 = pauVar48 + 1;
                  pauVar46 = (undefined1 (*) [16])(*pauVar46 + lVar44);
                } while (lVar47 < lVar56);
              }
              iVar45 = (int)lVar47;
              auVar79 = *(undefined1 (*) [16])(src + (long)(iVar45 * src_stride) + uVar53 + lVar33);
              auVar66._0_16_ = ZEXT116(0) * auVar79 + ZEXT116(1) * auVar79;
              auVar66._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar79
              ;
              auVar89 = vpshufb_avx2(auVar66,auVar89);
              auVar74 = vpshufb_avx2(auVar66,auVar74);
              auVar75 = vpshufb_avx2(auVar66,auVar75);
              auVar89 = vpmaddubsw_avx2(auVar89,auVar61);
              auVar74 = vpmaddubsw_avx2(auVar74,auVar80);
              auVar75 = vpmaddubsw_avx2(auVar75,auVar69);
              auVar74 = vpaddw_avx2(auVar74,auVar75);
              goto LAB_00445a83;
            }
            if (3 < iVar49) {
              pauVar48 = (undefined1 (*) [32])local_8c60;
              lVar47 = 0;
              pauVar46 = pauVar35;
              do {
                auVar67._0_16_ =
                     ZEXT116(0) * *(undefined1 (*) [16])(*pauVar46 + lVar55) +
                     ZEXT116(1) * *pauVar46;
                auVar67._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                     ZEXT116(1) * *(undefined1 (*) [16])(*pauVar46 + lVar55);
                auVar75 = vpshufb_avx2(auVar67,auVar89);
                auVar74 = vpshufb_avx2(auVar67,auVar74);
                auVar65 = vpshufb_avx2(auVar67,_DAT_005185e0);
                auVar67 = vpshufb_avx2(auVar67,_DAT_00518640);
                auVar66 = vpmaddubsw_avx2(auVar75,auVar61);
                auVar74 = vpmaddubsw_avx2(auVar74,auVar80);
                auVar75 = vpmaddubsw_avx2(auVar65,auVar69);
                auVar75 = vpaddw_avx2(auVar74,auVar75);
                auVar74._16_16_ = _DAT_00517860;
                auVar74._0_16_ = _DAT_00517860;
                auVar65 = vpmaddubsw_avx2(auVar67,auVar62);
                auVar66 = vpaddw_avx2(auVar87,auVar66);
                auVar75 = vpaddw_avx2(auVar66,auVar75);
                auVar75 = vpaddw_avx2(auVar75,auVar65);
                auVar75 = vpsraw_avx2(auVar75,auVar76);
                *pauVar48 = auVar75;
                lVar47 = lVar47 + 2;
                pauVar48 = pauVar48 + 1;
                pauVar46 = (undefined1 (*) [16])(*pauVar46 + lVar44);
              } while (lVar47 < lVar56);
            }
            iVar45 = (int)lVar47;
            auVar79 = *(undefined1 (*) [16])(src + (long)(iVar45 * src_stride) + uVar53 + lVar33);
            auVar68._0_16_ = ZEXT116(0) * auVar79 + ZEXT116(1) * auVar79;
            auVar68._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar79;
            auVar89 = vpshufb_avx2(auVar68,auVar89);
            auVar74 = vpshufb_avx2(auVar68,auVar74);
            auVar66 = vpshufb_avx2(auVar68,_DAT_005185e0);
            auVar65 = vpshufb_avx2(auVar68,_DAT_00518640);
            auVar75 = vpmaddubsw_avx2(auVar89,auVar61);
            auVar74 = vpmaddubsw_avx2(auVar74,auVar80);
            auVar89 = vpmaddubsw_avx2(auVar66,auVar69);
            auVar89 = vpaddw_avx2(auVar74,auVar89);
            auVar74 = vpmaddubsw_avx2(auVar65,auVar62);
            auVar75 = vpaddw_avx2(auVar87,auVar75);
            auVar89 = vpaddw_avx2(auVar75,auVar89);
          }
          auVar74 = vpaddw_avx2(auVar89,auVar74);
          auVar74 = vpsraw_avx2(auVar74,auVar76);
          *(undefined1 (*) [32])(local_8c60 + (ulong)(uint)(iVar45 << 3) * 2) = auVar74;
          auVar89 = auVar84._0_32_;
          auVar76 = auVar77._0_16_;
          auVar74 = auVar78._0_32_;
          auVar79 = auVar81._0_16_;
          if (iVar60 == 4) {
            if (0 < h) {
              auVar19._16_16_ = auStack_8c30;
              auVar19._0_16_ = local_8c40;
              auVar22._16_16_ = local_8c20;
              auVar22._0_16_ = auStack_8c30;
              auVar75 = vpunpckhwd_avx2(auVar19,auVar22);
              auVar13._16_16_ = auStack_8c50;
              auVar13._0_16_ = local_8c60;
              auVar16._16_16_ = local_8c40;
              auVar16._0_16_ = auStack_8c50;
              auVar66 = vpunpckhwd_avx2(auVar13,auVar16);
              auVar65 = vpunpcklwd_avx2(auVar19,auVar22);
              auVar67 = vpunpcklwd_avx2(auVar13,auVar16);
              pauVar48 = (undefined1 (*) [32])auStack_8c10;
              lVar47 = 0;
              puVar51 = local_8f68;
              do {
                auVar63 = auVar65;
                auVar68 = auVar75;
                auVar75 = vpmaddwd_avx2(auVar82,auVar67);
                auVar65 = vpmaddwd_avx2(auVar63,auVar89);
                auVar66 = vpmaddwd_avx2(auVar82,auVar66);
                auVar67 = vpmaddwd_avx2(auVar89,auVar68);
                auVar75 = vpaddd_avx2(auVar75,local_8e80);
                auVar75 = vpaddd_avx2(auVar75,auVar65);
                auVar65 = vpsrad_avx2(auVar75,auVar76);
                auVar75 = vpaddd_avx2(auVar66,local_8e80);
                auVar75 = vpaddd_avx2(auVar67,auVar75);
                auVar66 = vpsrad_avx2(auVar75,auVar76);
                auVar75 = vpaddd_avx2(auVar65,auVar74);
                auVar65 = vpsrad_avx2(auVar75,auVar79);
                auVar75 = vpaddd_avx2(auVar66,auVar74);
                auVar75 = vpsrad_avx2(auVar75,auVar79);
                auVar75 = vpackssdw_avx2(auVar65,auVar75);
                auVar75 = vpackuswb_avx2(auVar75,auVar75);
                if ((long)uVar53 < lVar54) {
                  *(long *)puVar51 = auVar75._0_8_;
                  *(long *)(puVar51 + lVar57) = auVar75._16_8_;
                }
                else if (w == 4) {
                  *(int *)puVar51 = auVar75._0_4_;
                  *(int *)(puVar51 + lVar57) = auVar75._16_4_;
                }
                else {
                  vpextrw_avx(auVar75._0_16_,0);
                  vpextrw_avx(auVar75._16_16_,0);
                }
                auVar65 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar48[-1] + 0x10),*pauVar48);
                auVar75 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar48[-1] + 0x10),*pauVar48);
                lVar47 = lVar47 + 2;
                puVar51 = puVar51 + lVar9;
                pauVar48 = pauVar48 + 1;
                auVar66 = auVar68;
                auVar67 = auVar63;
              } while (lVar47 < lVar58);
            }
          }
          else if (iVar60 == 6) {
            if (0 < h) {
              auVar20._16_16_ = auStack_8c30;
              auVar20._0_16_ = local_8c40;
              auVar23._16_16_ = local_8c20;
              auVar23._0_16_ = auStack_8c30;
              auVar75 = vpunpckhwd_avx2(auVar20,auVar23);
              auVar14._16_16_ = auStack_8c50;
              auVar14._0_16_ = local_8c60;
              auVar17._16_16_ = local_8c40;
              auVar17._0_16_ = auStack_8c50;
              auVar66 = vpunpckhwd_avx2(auVar14,auVar17);
              auVar67 = vpunpcklwd_avx2(auVar20,auVar23);
              auVar65 = vpunpcklwd_avx2(auVar14,auVar17);
              pauVar48 = (undefined1 (*) [32])auStack_8c10;
              lVar47 = 0;
              puVar51 = local_8f68;
              do {
                auVar64 = auVar75;
                auVar7 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar48[-1] + 0x10),*pauVar48);
                auVar75 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar48[-1] + 0x10),*pauVar48);
                auVar65 = vpmaddwd_avx2(auVar65,auVar70);
                auVar68 = vpmaddwd_avx2(auVar67,auVar82);
                auVar65 = vpaddd_avx2(auVar65,local_8e80);
                auVar65 = vpaddd_avx2(auVar68,auVar65);
                auVar68 = vpmaddwd_avx2(auVar7,auVar89);
                auVar63 = vpmaddwd_avx2(auVar66,auVar70);
                auVar66 = vpaddd_avx2(auVar68,auVar65);
                auVar68 = vpmaddwd_avx2(auVar82,auVar64);
                auVar65 = vpaddd_avx2(auVar63,local_8e80);
                auVar65 = vpaddd_avx2(auVar68,auVar65);
                auVar68 = vpmaddwd_avx2(auVar89,auVar75);
                auVar65 = vpaddd_avx2(auVar68,auVar65);
                auVar66 = vpsrad_avx2(auVar66,auVar76);
                auVar65 = vpsrad_avx2(auVar65,auVar76);
                auVar66 = vpaddd_avx2(auVar66,auVar74);
                auVar68 = vpsrad_avx2(auVar66,auVar79);
                auVar66 = vpaddd_avx2(auVar65,auVar74);
                auVar66 = vpsrad_avx2(auVar66,auVar79);
                auVar66 = vpackssdw_avx2(auVar68,auVar66);
                auVar66 = vpackuswb_avx2(auVar66,auVar66);
                if ((long)uVar53 < lVar54) {
                  *(long *)puVar51 = auVar66._0_8_;
                  *(long *)(puVar51 + lVar57) = auVar66._16_8_;
                }
                else if (w == 4) {
                  *(int *)puVar51 = auVar66._0_4_;
                  *(int *)(puVar51 + lVar57) = auVar66._16_4_;
                }
                else {
                  vpextrw_avx(auVar66._0_16_,0);
                  vpextrw_avx(auVar66._16_16_,0);
                }
                lVar47 = lVar47 + 2;
                puVar51 = puVar51 + lVar9;
                pauVar48 = pauVar48 + 1;
                auVar65 = auVar67;
                auVar67 = auVar7;
                auVar66 = auVar64;
              } while (lVar47 < lVar58);
            }
          }
          else if (0 < h) {
            auVar26._16_16_ = auStack_8c10;
            auVar26._0_16_ = local_8c20;
            auVar28._16_16_ = local_8c00;
            auVar28._0_16_ = auStack_8c10;
            auVar75 = vpunpckhwd_avx2(auVar26,auVar28);
            auVar83._16_16_ = auStack_8c30;
            auVar83._0_16_ = local_8c40;
            auVar24._16_16_ = local_8c20;
            auVar24._0_16_ = auStack_8c30;
            auVar74 = vpunpckhwd_avx2(auVar83,auVar24);
            auVar7._16_16_ = auStack_8c50;
            auVar7._0_16_ = local_8c60;
            auVar8._16_16_ = local_8c40;
            auVar8._0_16_ = auStack_8c50;
            auVar89 = vpunpckhwd_avx2(auVar7,auVar8);
            auVar66 = vpunpcklwd_avx2(auVar26,auVar28);
            auVar65 = vpunpcklwd_avx2(auVar83,auVar24);
            auVar67 = vpunpcklwd_avx2(auVar7,auVar8);
            pauVar48 = (undefined1 (*) [32])auStack_8bf0;
            lVar47 = 0;
            puVar51 = local_8f68;
            do {
              auVar8 = auVar66;
              auVar66 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar48[-1] + 0x10),*pauVar48);
              auVar7 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar48[-1] + 0x10),*pauVar48);
              auVar68 = vpmaddwd_avx2(auVar65,auVar82);
              auVar83 = auVar84._0_32_;
              auVar63 = vpmaddwd_avx2(auVar83,auVar8);
              auVar68 = vpaddd_avx2(auVar63,auVar68);
              auVar63 = vpmaddwd_avx2(auVar74,auVar82);
              auVar64 = vpmaddwd_avx2(auVar83,auVar75);
              auVar63 = vpaddd_avx2(auVar63,auVar64);
              auVar67 = vpmaddwd_avx2(auVar67,auVar70);
              auVar67 = vpaddd_avx2(local_8e80,auVar67);
              auVar67 = vpaddd_avx2(auVar67,auVar68);
              auVar79 = auVar81._0_16_;
              auVar64 = auVar78._0_32_;
              auVar76 = auVar77._0_16_;
              auVar68 = vpmaddwd_avx2(auVar66,local_8e60);
              auVar67 = vpaddd_avx2(auVar67,auVar68);
              auVar89 = vpmaddwd_avx2(auVar89,auVar70);
              auVar89 = vpaddd_avx2(local_8e80,auVar89);
              auVar89 = vpaddd_avx2(auVar89,auVar63);
              auVar68 = vpmaddwd_avx2(auVar7,local_8e60);
              auVar77 = ZEXT1664(auVar76);
              auVar78 = ZEXT3264(auVar64);
              auVar81 = ZEXT1664(auVar79);
              auVar89 = vpaddd_avx2(auVar89,auVar68);
              auVar67 = vpsrad_avx2(auVar67,auVar76);
              auVar68 = vpsrad_avx2(auVar89,auVar76);
              auVar89 = vpaddd_avx2(auVar67,auVar64);
              auVar67 = vpsrad_avx2(auVar89,auVar79);
              auVar89 = vpaddd_avx2(auVar68,auVar64);
              auVar89 = vpsrad_avx2(auVar89,auVar79);
              auVar89 = vpackssdw_avx2(auVar67,auVar89);
              auVar89 = vpackuswb_avx2(auVar89,auVar89);
              if ((long)uVar53 < lVar54) {
                *(long *)puVar51 = auVar89._0_8_;
                *(long *)(puVar51 + lVar57) = auVar89._16_8_;
              }
              else if (w == 4) {
                *(int *)puVar51 = auVar89._0_4_;
                *(int *)(puVar51 + lVar57) = auVar89._16_4_;
              }
              else {
                vpextrw_avx(auVar89._0_16_,0);
                vpextrw_avx(auVar89._16_16_,0);
              }
              auVar84 = ZEXT3264(auVar83);
              lVar47 = lVar47 + 2;
              puVar51 = puVar51 + lVar9;
              pauVar48 = pauVar48 + 1;
              auVar67 = auVar65;
              auVar89 = auVar74;
              auVar74 = auVar75;
              auVar65 = auVar8;
              auVar75 = auVar7;
            } while (lVar47 < lVar58);
          }
          uVar53 = uVar53 + 8;
          pauVar35 = (undefined1 (*) [16])(*pauVar35 + 8);
          local_8f68 = local_8f68 + 8;
          auVar89._16_16_ = _DAT_00517c80;
          auVar89._0_16_ = _DAT_00517c80;
          auVar74._16_16_ = _DAT_00517860;
          auVar74._0_16_ = _DAT_00517860;
        } while (uVar53 < (uint)w);
      }
    }
    else {
      bVar38 = (byte)conv_params->round_0;
      bVar36 = 0x16 - bVar38;
      uVar52 = 0xe - (conv_params->round_0 + conv_params->round_1);
      bVar37 = (byte)conv_params->round_1;
      iVar43 = 1 << (bVar36 - bVar37 & 0x1f);
      if (0 < w) {
        iVar49 = ((1 << (bVar38 & 0x1f)) >> 1) + 0x4000;
        auVar80._4_4_ = iVar49;
        auVar80._0_4_ = iVar49;
        auVar80._8_4_ = iVar49;
        auVar80._12_4_ = iVar49;
        auVar80._16_4_ = iVar49;
        auVar80._20_4_ = iVar49;
        auVar80._24_4_ = iVar49;
        auVar80._28_4_ = iVar49;
        uVar4 = conv_params->round_0;
        local_8d80._4_4_ = ((1 << (bVar37 & 0x1f)) >> 1) + (1 << (bVar36 & 0x1f));
        local_8d80._0_4_ = local_8d80._4_4_;
        local_8d80._8_4_ = local_8d80._4_4_;
        local_8d80._12_4_ = local_8d80._4_4_;
        local_8d80._16_4_ = local_8d80._4_4_;
        local_8d80._20_4_ = local_8d80._4_4_;
        local_8d80._24_4_ = local_8d80._4_4_;
        local_8d80._28_4_ = local_8d80._4_4_;
        iVar43 = ((1 << ((byte)uVar52 & 0x1f)) >> 1) - ((iVar43 >> 1) + iVar43);
        uVar34 = h + 0xb;
        uVar39 = (undefined4)*(undefined8 *)(piVar6 + uVar59 + 8);
        local_8da0._4_4_ = (undefined4)((ulong)*(undefined8 *)(piVar6 + uVar59 + 8) >> 0x20);
        local_8da0._0_4_ = local_8da0._4_4_;
        local_8da0._8_4_ = local_8da0._4_4_;
        local_8da0._12_4_ = local_8da0._4_4_;
        local_8da0._16_4_ = local_8da0._4_4_;
        local_8da0._20_4_ = local_8da0._4_4_;
        local_8da0._24_4_ = local_8da0._4_4_;
        local_8da0._28_4_ = local_8da0._4_4_;
        local_8dc0._4_4_ = *(undefined4 *)(piVar6 + uVar59 + 6);
        local_8dc0._0_4_ = local_8dc0._4_4_;
        local_8dc0._8_4_ = local_8dc0._4_4_;
        local_8dc0._12_4_ = local_8dc0._4_4_;
        local_8dc0._16_4_ = local_8dc0._4_4_;
        local_8dc0._20_4_ = local_8dc0._4_4_;
        local_8dc0._24_4_ = local_8dc0._4_4_;
        local_8dc0._28_4_ = local_8dc0._4_4_;
        local_8de0._4_4_ = *(undefined4 *)(piVar6 + uVar59 + 4);
        local_8de0._0_4_ = local_8de0._4_4_;
        local_8de0._8_4_ = local_8de0._4_4_;
        local_8de0._12_4_ = local_8de0._4_4_;
        local_8de0._16_4_ = local_8de0._4_4_;
        local_8de0._20_4_ = local_8de0._4_4_;
        local_8de0._24_4_ = local_8de0._4_4_;
        local_8de0._28_4_ = local_8de0._4_4_;
        local_8e00._4_4_ = *(undefined4 *)(piVar6 + uVar59 + 2);
        local_8e00._0_4_ = local_8e00._4_4_;
        local_8e00._8_4_ = local_8e00._4_4_;
        local_8e00._12_4_ = local_8e00._4_4_;
        local_8e00._16_4_ = local_8e00._4_4_;
        local_8e00._20_4_ = local_8e00._4_4_;
        local_8e00._24_4_ = local_8e00._4_4_;
        local_8e00._28_4_ = local_8e00._4_4_;
        local_8e40._4_4_ = *(undefined4 *)(piVar6 + uVar59);
        local_8e40._0_4_ = local_8e40._4_4_;
        local_8e40._8_4_ = local_8e40._4_4_;
        local_8e40._12_4_ = local_8e40._4_4_;
        local_8e40._16_4_ = local_8e40._4_4_;
        local_8e40._20_4_ = local_8e40._4_4_;
        local_8e40._24_4_ = local_8e40._4_4_;
        local_8e40._28_4_ = local_8e40._4_4_;
        uVar40 = (undefined4)*(undefined8 *)(piVar5 + uVar53 + 8);
        uVar41 = (undefined4)((ulong)*(undefined8 *)(piVar5 + uVar53 + 8) >> 0x20);
        auVar69._4_4_ = uVar41;
        auVar69._0_4_ = uVar41;
        auVar69._8_4_ = uVar41;
        auVar69._12_4_ = uVar41;
        auVar69._16_4_ = uVar41;
        auVar69._20_4_ = uVar41;
        auVar69._24_4_ = uVar41;
        auVar69._28_4_ = uVar41;
        auVar61._4_4_ = uVar40;
        auVar61._0_4_ = uVar40;
        auVar61._8_4_ = uVar40;
        auVar61._12_4_ = uVar40;
        auVar61._16_4_ = uVar40;
        auVar61._20_4_ = uVar40;
        auVar61._24_4_ = uVar40;
        auVar61._28_4_ = uVar40;
        uVar40 = *(undefined4 *)(piVar5 + uVar53 + 6);
        auVar82._4_4_ = uVar40;
        auVar82._0_4_ = uVar40;
        auVar82._8_4_ = uVar40;
        auVar82._12_4_ = uVar40;
        auVar82._16_4_ = uVar40;
        auVar82._20_4_ = uVar40;
        auVar82._24_4_ = uVar40;
        auVar82._28_4_ = uVar40;
        uVar40 = *(undefined4 *)(piVar5 + uVar53 + 4);
        auVar85._4_4_ = uVar40;
        auVar85._0_4_ = uVar40;
        auVar85._8_4_ = uVar40;
        auVar85._12_4_ = uVar40;
        auVar85._16_4_ = uVar40;
        auVar85._20_4_ = uVar40;
        auVar85._24_4_ = uVar40;
        auVar85._28_4_ = uVar40;
        uVar40 = *(undefined4 *)(piVar5 + uVar53 + 2);
        auVar86._4_4_ = uVar40;
        auVar86._0_4_ = uVar40;
        auVar86._8_4_ = uVar40;
        auVar86._12_4_ = uVar40;
        auVar86._16_4_ = uVar40;
        auVar86._20_4_ = uVar40;
        auVar86._24_4_ = uVar40;
        auVar86._28_4_ = uVar40;
        uVar40 = *(undefined4 *)(piVar5 + uVar53);
        auVar88._4_4_ = uVar40;
        auVar88._0_4_ = uVar40;
        auVar88._8_4_ = uVar40;
        auVar88._12_4_ = uVar40;
        auVar88._16_4_ = uVar40;
        auVar88._20_4_ = uVar40;
        auVar88._24_4_ = uVar40;
        auVar88._28_4_ = uVar40;
        uVar53 = 1;
        if (1 < (int)uVar34) {
          uVar53 = (ulong)uVar34;
        }
        lVar54 = (long)dst_stride;
        local_8f28 = (undefined1 (*) [16])(src + ~(long)(src_stride * 5));
        uVar59 = 0;
        uVar1 = conv_params->round_1;
        local_8f30 = (undefined1 (*) [16])(src + (-5 - (long)(src_stride * 5)));
        do {
          auVar62 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          if (w < 5) {
            if (-0xb < h) {
              puVar50 = (undefined8 *)local_8c60;
              lVar44 = 0;
              uVar42 = local_8f70;
              pauVar35 = local_8f30;
              do {
                auVar76 = *(undefined1 (*) [16])
                           (*(undefined1 (*) [16])(src + (-5 - (long)(src_stride * 5))) +
                           (int)uVar42);
                auVar71._0_16_ = ZEXT116(0) * auVar76 + ZEXT116(1) * *pauVar35;
                auVar71._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar76;
                auVar87 = vpunpcklbw_avx2(auVar71,auVar62);
                auVar75 = vpunpckhbw_avx2(auVar71,auVar62);
                auVar70 = vpshufd_avx2(auVar87,0xe6);
                auVar74 = vpshuflw_avx2(auVar70,0x50);
                auVar89 = vpshufhw_avx2(auVar74,0xfa);
                auVar74 = vpunpcklwd_avx2(auVar87,auVar87);
                auVar70 = vpalignr_avx2(auVar70,auVar74,2);
                auVar74 = vpalignr_avx2(auVar89,auVar74,10);
                auVar65 = vpunpcklwd_avx2(auVar75,auVar75);
                auVar87 = vpalignr_avx2(auVar75,auVar89,2);
                auVar89 = vpalignr_avx2(auVar65,auVar89,10);
                auVar75 = vpshufd_avx2(auVar75,0xe6);
                auVar66 = vpshuflw_avx2(auVar75,0x50);
                auVar66 = vpshufd_avx2(auVar66,0xf4);
                auVar75 = vpalignr_avx2(auVar75,auVar65,2);
                auVar66 = vpalignr_avx2(auVar66,auVar65,10);
                auVar65 = vpmaddwd_avx2(auVar88,auVar70);
                auVar67 = vpmaddwd_avx2(auVar86,auVar74);
                auVar70 = vpmaddwd_avx2(auVar85,auVar87);
                auVar74 = vpmaddwd_avx2(auVar82,auVar89);
                auVar70 = vpaddd_avx2(auVar70,auVar74);
                auVar74 = vpmaddwd_avx2(auVar75,auVar61);
                auVar87 = vpmaddwd_avx2(auVar66,auVar69);
                auVar74 = vpaddd_avx2(auVar74,auVar87);
                auVar87 = vpaddd_avx2(auVar80,auVar65);
                auVar87 = vpaddd_avx2(auVar87,auVar67);
                auVar70 = vpaddd_avx2(auVar87,auVar70);
                auVar70 = vpaddd_avx2(auVar70,auVar74);
                auVar70 = vpsrad_avx2(auVar70,ZEXT416(uVar4));
                auVar70 = vpackssdw_avx2(auVar70,auVar61);
                if (w < 3) {
                  *(short *)puVar50 = auVar70._0_2_;
                  *(short *)((long)puVar50 + 2) = auVar70._2_2_;
                  *(short *)(puVar50 + 2) = auVar70._16_2_;
                  *(short *)((long)puVar50 + 0x12) = auVar70._18_2_;
                }
                else {
                  *puVar50 = auVar70._0_8_;
                  puVar50[2] = auVar70._16_8_;
                }
                lVar44 = lVar44 + 2;
                puVar50 = puVar50 + 4;
                pauVar35 = (undefined1 (*) [16])(*pauVar35 + (long)src_stride * 2);
                uVar42 = (ulong)(uint)((int)uVar42 + src_stride * 2);
              } while (lVar44 < (int)uVar34);
            }
          }
          else if (-0xb < h) {
            lVar44 = 0;
            pauVar35 = local_8f28;
            do {
              auVar72._0_16_ =
                   ZEXT116(0) * *pauVar35 + ZEXT116(1) * *(undefined1 (*) [16])(pauVar35[-1] + 0xc);
              auVar72._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * *pauVar35;
              auVar87 = vpunpcklbw_avx2(auVar72,auVar62);
              auVar75 = vpunpckhbw_avx2(auVar72,auVar62);
              auVar70 = vpshufd_avx2(auVar87,0xe6);
              auVar74 = vpshuflw_avx2(auVar70,0x50);
              auVar89 = vpshufhw_avx2(auVar74,0xfa);
              auVar74 = vpunpcklwd_avx2(auVar87,auVar87);
              auVar70 = vpalignr_avx2(auVar70,auVar74,2);
              auVar74 = vpalignr_avx2(auVar89,auVar74,10);
              auVar65 = vpunpcklwd_avx2(auVar75,auVar75);
              auVar87 = vpalignr_avx2(auVar75,auVar89,2);
              auVar89 = vpalignr_avx2(auVar65,auVar89,10);
              auVar75 = vpshufd_avx2(auVar75,0xe6);
              auVar66 = vpshuflw_avx2(auVar75,0x50);
              auVar66 = vpshufd_avx2(auVar66,0xf4);
              auVar75 = vpalignr_avx2(auVar75,auVar65,2);
              auVar66 = vpalignr_avx2(auVar66,auVar65,10);
              auVar65 = vpmaddwd_avx2(auVar88,auVar70);
              auVar67 = vpmaddwd_avx2(auVar86,auVar74);
              auVar70 = vpmaddwd_avx2(auVar85,auVar87);
              auVar74 = vpmaddwd_avx2(auVar82,auVar89);
              auVar70 = vpaddd_avx2(auVar70,auVar74);
              auVar74 = vpmaddwd_avx2(auVar75,auVar61);
              auVar87 = vpmaddwd_avx2(auVar66,auVar69);
              auVar74 = vpaddd_avx2(auVar74,auVar87);
              auVar87 = vpaddd_avx2(auVar80,auVar65);
              auVar87 = vpaddd_avx2(auVar87,auVar67);
              auVar70 = vpaddd_avx2(auVar87,auVar70);
              auVar70 = vpaddd_avx2(auVar70,auVar74);
              auVar70 = vpsrad_avx2(auVar70,ZEXT416(uVar4));
              auVar76 = vpackssdw_avx(auVar70._0_16_,auVar70._16_16_);
              *(undefined1 (*) [16])(local_8c60 + lVar44) = auVar76;
              lVar44 = lVar44 + 0x10;
              pauVar35 = (undefined1 (*) [16])(*pauVar35 + src_stride);
            } while (uVar53 << 4 != lVar44);
          }
          if (0 < h) {
            auVar31._16_16_ = auStack_8bd0;
            auVar31._0_16_ = local_8be0;
            auVar32._16_16_ = local_8bc0;
            auVar32._0_16_ = auStack_8bd0;
            auVar62 = vpunpckhwd_avx2(auVar31,auVar32);
            auVar29._16_16_ = auStack_8bf0;
            auVar29._0_16_ = local_8c00;
            auVar30._16_16_ = local_8be0;
            auVar30._0_16_ = auStack_8bf0;
            auVar70 = vpunpckhwd_avx2(auVar29,auVar30);
            auVar25._16_16_ = auStack_8c10;
            auVar25._0_16_ = local_8c20;
            auVar27._16_16_ = local_8c00;
            auVar27._0_16_ = auStack_8c10;
            auVar74 = vpunpckhwd_avx2(auVar25,auVar27);
            auVar18._16_16_ = auStack_8c30;
            auVar18._0_16_ = local_8c40;
            auVar21._16_16_ = local_8c20;
            auVar21._0_16_ = auStack_8c30;
            auVar87 = vpunpckhwd_avx2(auVar18,auVar21);
            auVar12._16_16_ = auStack_8c50;
            auVar12._0_16_ = local_8c60;
            auVar15._16_16_ = local_8c40;
            auVar15._0_16_ = auStack_8c50;
            auVar89 = vpunpckhwd_avx2(auVar12,auVar15);
            auVar75 = vpunpcklwd_avx2(auVar31,auVar32);
            auVar66 = vpunpcklwd_avx2(auVar29,auVar30);
            auVar65 = vpunpcklwd_avx2(auVar25,auVar27);
            auVar67 = vpunpcklwd_avx2(auVar18,auVar21);
            auVar68 = vpunpcklwd_avx2(auVar12,auVar15);
            pauVar48 = (undefined1 (*) [32])auStack_8bb0;
            lVar44 = 0;
            puVar51 = local_8f68;
            do {
              auVar26 = auVar65;
              auVar24 = auVar62;
              auVar83 = auVar87;
              auVar65 = auVar66;
              auVar87 = auVar74;
              auVar8 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar48[-1] + 0x10),*pauVar48);
              auVar62 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar48[-1] + 0x10),*pauVar48);
              auVar74 = vpmaddwd_avx2(auVar67,local_8e00);
              auVar66 = vpmaddwd_avx2(auVar26,local_8de0);
              auVar74 = vpaddd_avx2(auVar74,auVar66);
              auVar66 = vpmaddwd_avx2(auVar65,local_8dc0);
              auVar11._4_4_ = uVar39;
              auVar11._0_4_ = uVar39;
              auVar11._8_4_ = uVar39;
              auVar11._12_4_ = uVar39;
              auVar11._16_4_ = uVar39;
              auVar11._20_4_ = uVar39;
              auVar11._24_4_ = uVar39;
              auVar11._28_4_ = uVar39;
              auVar63 = vpmaddwd_avx2(auVar75,auVar11);
              auVar66 = vpaddd_avx2(auVar66,auVar63);
              auVar63 = vpmaddwd_avx2(auVar83,local_8e00);
              auVar64 = vpmaddwd_avx2(auVar87,local_8de0);
              auVar63 = vpaddd_avx2(auVar63,auVar64);
              auVar64 = vpmaddwd_avx2(auVar70,local_8dc0);
              auVar7 = vpmaddwd_avx2(auVar24,auVar11);
              auVar64 = vpaddd_avx2(auVar64,auVar7);
              auVar68 = vpmaddwd_avx2(auVar68,local_8e40);
              auVar68 = vpaddd_avx2(auVar68,local_8d80);
              auVar74 = vpaddd_avx2(auVar68,auVar74);
              auVar74 = vpaddd_avx2(auVar74,auVar66);
              auVar66 = vpmaddwd_avx2(local_8da0,auVar8);
              auVar74 = vpaddd_avx2(auVar66,auVar74);
              auVar89 = vpmaddwd_avx2(auVar89,local_8e40);
              auVar89 = vpaddd_avx2(auVar89,local_8d80);
              auVar89 = vpaddd_avx2(auVar89,auVar63);
              auVar89 = vpaddd_avx2(auVar89,auVar64);
              auVar66 = vpmaddwd_avx2(local_8da0,auVar62);
              auVar89 = vpaddd_avx2(auVar89,auVar66);
              auVar74 = vpsrad_avx2(auVar74,ZEXT416(uVar1));
              auVar89 = vpsrad_avx2(auVar89,ZEXT416(uVar1));
              auVar10._4_4_ = iVar43;
              auVar10._0_4_ = iVar43;
              auVar10._8_4_ = iVar43;
              auVar10._12_4_ = iVar43;
              auVar10._16_4_ = iVar43;
              auVar10._20_4_ = iVar43;
              auVar10._24_4_ = iVar43;
              auVar10._28_4_ = iVar43;
              auVar74 = vpaddd_avx2(auVar74,auVar10);
              auVar66 = vpsrad_avx2(auVar74,ZEXT416(uVar52));
              auVar74 = vpaddd_avx2(auVar89,auVar10);
              auVar74 = vpsrad_avx2(auVar74,ZEXT416(uVar52));
              auVar74 = vpackssdw_avx2(auVar66,auVar74);
              auVar74 = vpackuswb_avx2(auVar74,auVar74);
              if ((long)uVar59 < (long)((ulong)(uint)w - 4)) {
                *(long *)puVar51 = auVar74._0_8_;
                *(long *)(puVar51 + lVar54) = auVar74._16_8_;
              }
              else if (w == 4) {
                *(int *)puVar51 = auVar74._0_4_;
                *(int *)(puVar51 + lVar54) = auVar74._16_4_;
              }
              else {
                vpextrw_avx(auVar74._0_16_,0);
                vpextrw_avx(auVar74._16_16_,0);
              }
              lVar44 = lVar44 + 2;
              puVar51 = puVar51 + lVar54 * 2;
              pauVar48 = pauVar48 + 1;
              auVar74 = auVar70;
              auVar66 = auVar75;
              auVar75 = auVar8;
              auVar89 = auVar83;
              auVar70 = auVar24;
              auVar68 = auVar67;
              auVar67 = auVar26;
            } while (lVar44 < h);
          }
          uVar59 = uVar59 + 8;
          local_8f28 = (undefined1 (*) [16])(*local_8f28 + 8);
          local_8f30 = (undefined1 (*) [16])(*local_8f30 + 8);
          local_8f70 = (ulong)((int)local_8f70 + 8);
          local_8f68 = local_8f68 + 8;
        } while (uVar59 < (uint)w);
      }
    }
  }
  else {
    lVar54 = 8;
    if ((piVar5[uVar53 + 7] == 0 && piVar5[uVar53] == 0) &&
       (lVar54 = 6, piVar5[uVar53 + 6] == 0 && piVar5[uVar53 + 1] == 0)) {
      lVar54 = (ulong)(piVar5[uVar53 + 5] != 0 || piVar5[uVar53 + 2] != 0) * 2 + 2;
    }
    uVar53 = 0xc;
    if (((uVar3 != 0xc) && (uVar53 = 8, piVar6[uVar59 + 7] == 0 && piVar6[uVar59] == 0)) &&
       (uVar53 = 6, piVar6[uVar59 + 6] == 0 && piVar6[uVar59 + 1] == 0)) {
      uVar53 = (ulong)((uint)(piVar6[uVar59 + 5] != 0 || piVar6[uVar59 + 2] != 0) * 2 + 2);
    }
    (**(code **)(av1_convolve_2d_sr_specialized_avx2_convolve_2d_sr_hor_tap_func_table + lVar54 * 8)
    )((long)src - (long)(((int)(uVar53 >> 1) + -1) * src_stride),local_8f70,w,(int)uVar53 + h,
      filter_params_x,subpel_x_qn,local_8c60);
    (**(code **)(av1_convolve_2d_sr_specialized_avx2_convolve_2d_sr_ver_tap_func_table +
                (ulong)((int)uVar53 - (uint)(subpel_y_qn == 8)) * 8))
              (local_8c60,w,h,filter_params_y,subpel_y_qn,dst,dst_stride);
  }
  return;
}

Assistant:

void av1_convolve_2d_sr_avx2(
    const uint8_t *src, int32_t src_stride, uint8_t *dst, int32_t dst_stride,
    int32_t w, int32_t h, const InterpFilterParams *filter_params_x,
    const InterpFilterParams *filter_params_y, const int32_t subpel_x_qn,
    const int32_t subpel_y_qn, ConvolveParams *conv_params) {
#if CONFIG_SVT_AV1
  const int32_t tap_x = get_filter_tap(filter_params_x, subpel_x_qn);
  const int32_t tap_y = get_filter_tap(filter_params_y, subpel_y_qn);

  const bool use_general = (tap_x == 12 || tap_y == 12);
  if (use_general) {
    convolve_2d_sr_general_avx2(src, src_stride, dst, dst_stride, w, h,
                                filter_params_x, filter_params_y, subpel_x_qn,
                                subpel_y_qn, conv_params);
  } else {
    av1_convolve_2d_sr_specialized_avx2(src, src_stride, dst, dst_stride, w, h,
                                        filter_params_x, filter_params_y,
                                        subpel_x_qn, subpel_y_qn, conv_params);
  }
#else
  convolve_2d_sr_general_avx2(src, src_stride, dst, dst_stride, w, h,
                              filter_params_x, filter_params_y, subpel_x_qn,
                              subpel_y_qn, conv_params);
#endif
}